

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

tm * __thiscall
absl::lts_20240722::ToTM(tm *__return_storage_ptr__,lts_20240722 *this,Time t,TimeZone tz)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined6 uVar3;
  undefined1 auVar4 [12];
  int iVar5;
  Weekday WVar6;
  short sVar7;
  undefined1 auVar8 [16];
  Time t_00;
  CivilSecond cs;
  CivilSecond cs_00;
  TimeZone local_48;
  CivilInfo local_40;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined2 uVar11;
  
  local_48._4_4_ = (undefined4)((ulong)register0x00000008 >> 0x20);
  local_48._0_4_ = t.rep_.rep_lo_;
  *(undefined8 *)&__return_storage_ptr__->tm_isdst = 0;
  __return_storage_ptr__->tm_gmtoff = 0;
  __return_storage_ptr__->tm_mon = 0;
  __return_storage_ptr__->tm_year = 0;
  __return_storage_ptr__->tm_wday = 0;
  __return_storage_ptr__->tm_yday = 0;
  __return_storage_ptr__->tm_zone = (char *)0x0;
  t_00.rep_.rep_lo_ = t.rep_.rep_hi_.lo_;
  t_00.rep_.rep_hi_ = (HiRep)this;
  TimeZone::At(&local_40,&local_48,t_00);
  uVar11 = CONCAT11(local_40.cs.f_.ss,local_40.cs.f_.ss);
  uVar1 = CONCAT35(CONCAT21(uVar11,local_40.cs.f_.mm),
                   CONCAT14(local_40.cs.f_.mm,local_40.cs.f_._9_4_));
  uVar3 = CONCAT51(CONCAT41((int)((ulong)uVar1 >> 0x20),local_40.cs.f_.hh),local_40.cs.f_.hh);
  sVar7 = CONCAT11(local_40.cs.f_.d,local_40.cs.f_.d);
  uVar2 = CONCAT62(uVar3,sVar7);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar2;
  auVar10._12_2_ = uVar11;
  auVar10._14_2_ = uVar11;
  uVar11 = (undefined2)((ulong)uVar1 >> 0x20);
  auVar9._12_4_ = auVar10._12_4_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar2;
  auVar9._10_2_ = uVar11;
  auVar8._10_6_ = auVar9._10_6_;
  auVar8._8_2_ = uVar11;
  auVar8._0_8_ = uVar2;
  uVar11 = (undefined2)uVar3;
  auVar4._4_8_ = auVar8._8_8_;
  auVar4._2_2_ = uVar11;
  auVar4._0_2_ = uVar11;
  __return_storage_ptr__->tm_sec = auVar9._12_4_ >> 0x18;
  __return_storage_ptr__->tm_min = auVar8._8_4_ >> 0x18;
  __return_storage_ptr__->tm_hour = auVar4._0_4_ >> 0x18;
  __return_storage_ptr__->tm_mday = (int)sVar7 >> 8;
  __return_storage_ptr__->tm_mon = local_40.cs.f_.m + -1;
  iVar5 = -0x80000000;
  if ((-0x7ffff895 < local_40.cs.f_.y) && (iVar5 = 0x7ffff893, local_40.cs.f_.y < 0x80000000)) {
    iVar5 = (int)local_40.cs.f_.y + -0x76c;
  }
  __return_storage_ptr__->tm_year = iVar5;
  cs.f_.y._1_1_ = local_40.cs.f_.d;
  cs.f_.y._2_1_ = local_40.cs.f_.hh;
  cs.f_.y._3_1_ = local_40.cs.f_.mm;
  cs.f_.y._4_1_ = local_40.cs.f_.ss;
  cs.f_.y._0_1_ = local_40.cs.f_.m;
  cs.f_.y._5_3_ = local_40.cs.f_._13_3_;
  cs.f_.m = (char)extraout_RDX;
  cs.f_.d = (char)((ulong)extraout_RDX >> 8);
  cs.f_.hh = (char)((ulong)extraout_RDX >> 0x10);
  cs.f_.mm = (char)((ulong)extraout_RDX >> 0x18);
  cs.f_.ss = (char)((ulong)extraout_RDX >> 0x20);
  cs.f_._13_3_ = (int3)((ulong)extraout_RDX >> 0x28);
  WVar6 = GetWeekday((lts_20240722 *)local_40.cs.f_.y,cs);
  if (WVar6 < (sunday|tuesday)) {
    __return_storage_ptr__->tm_wday = *(int *)(&DAT_0010d554 + (ulong)WVar6 * 4);
  }
  cs_00.f_.y._1_1_ = local_40.cs.f_.d;
  cs_00.f_.y._2_1_ = local_40.cs.f_.hh;
  cs_00.f_.y._3_1_ = local_40.cs.f_.mm;
  cs_00.f_.y._4_1_ = local_40.cs.f_.ss;
  cs_00.f_.y._0_1_ = local_40.cs.f_.m;
  cs_00.f_.y._5_3_ = local_40.cs.f_._13_3_;
  cs_00.f_.m = (char)extraout_RDX_00;
  cs_00.f_.d = (char)((ulong)extraout_RDX_00 >> 8);
  cs_00.f_.hh = (char)((ulong)extraout_RDX_00 >> 0x10);
  cs_00.f_.mm = (char)((ulong)extraout_RDX_00 >> 0x18);
  cs_00.f_.ss = (char)((ulong)extraout_RDX_00 >> 0x20);
  cs_00.f_._13_3_ = (int3)((ulong)extraout_RDX_00 >> 0x28);
  iVar5 = GetYearDay((lts_20240722 *)local_40.cs.f_.y,cs_00);
  __return_storage_ptr__->tm_yday = iVar5 + -1;
  __return_storage_ptr__->tm_isdst = (uint)local_40.is_dst;
  return __return_storage_ptr__;
}

Assistant:

struct tm ToTM(absl::Time t, absl::TimeZone tz) {
  struct tm tm = {};

  const auto ci = tz.At(t);
  const auto& cs = ci.cs;
  tm.tm_sec = cs.second();
  tm.tm_min = cs.minute();
  tm.tm_hour = cs.hour();
  tm.tm_mday = cs.day();
  tm.tm_mon = cs.month() - 1;

  // Saturates tm.tm_year in cases of over/underflow, accounting for the fact
  // that tm.tm_year is years since 1900.
  if (cs.year() < std::numeric_limits<int>::min() + 1900) {
    tm.tm_year = std::numeric_limits<int>::min();
  } else if (cs.year() > std::numeric_limits<int>::max()) {
    tm.tm_year = std::numeric_limits<int>::max() - 1900;
  } else {
    tm.tm_year = static_cast<int>(cs.year() - 1900);
  }

  switch (GetWeekday(cs)) {
    case Weekday::sunday:
      tm.tm_wday = 0;
      break;
    case Weekday::monday:
      tm.tm_wday = 1;
      break;
    case Weekday::tuesday:
      tm.tm_wday = 2;
      break;
    case Weekday::wednesday:
      tm.tm_wday = 3;
      break;
    case Weekday::thursday:
      tm.tm_wday = 4;
      break;
    case Weekday::friday:
      tm.tm_wday = 5;
      break;
    case Weekday::saturday:
      tm.tm_wday = 6;
      break;
  }
  tm.tm_yday = GetYearDay(cs) - 1;
  tm.tm_isdst = ci.is_dst ? 1 : 0;

  return tm;
}